

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O1

XMLReader * __thiscall
xercesc_4_0::ReaderMgr::createReader
          (ReaderMgr *this,XMLCh *baseURI,XMLCh *sysId,XMLCh *pubId,bool xmlDecl,RefFrom refFrom,
          Types type,Sources source,InputSource **srcToFill,bool calcSrcOfs,XMLSize_t lowWaterMark,
          bool disableDefaultEntityResolution)

{
  uint uVar1;
  XMLEntityHandler *pXVar2;
  XMLCh *chars;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  InputSource *this_00;
  URLInputSource *this_01;
  XMLReader *pXVar5;
  MalformedURLException *this_02;
  undefined7 in_register_00000081;
  XMLBuffer expSysId;
  XMLBuffer resolvedSysId;
  XMLBuffer normalizedSysId;
  XMLResourceIdentifier resourceIdentifier;
  LastExtEntityInfo lastInfo;
  
  normalizedSysId.fMemoryManager = this->fMemoryManager;
  normalizedSysId.fIndex = 0;
  normalizedSysId.fCapacity = 0x3ff;
  normalizedSysId.fFullSize = 0;
  normalizedSysId.fUsed = false;
  normalizedSysId.fFullHandler = (XMLBufferFullHandler *)0x0;
  normalizedSysId.fBuffer = (XMLCh *)0x0;
  iVar4 = (*(normalizedSysId.fMemoryManager)->_vptr_MemoryManager[3])
                    (normalizedSysId.fMemoryManager,0x800,sysId,pubId,
                     CONCAT71(in_register_00000081,xmlDecl));
  normalizedSysId.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar4);
  *normalizedSysId.fBuffer = L'\0';
  resourceIdentifier.fResourceIdentifierType =
       CONCAT22(resourceIdentifier.fResourceIdentifierType._2_2_,0xffff);
  XMLString::removeChar(sysId,(XMLCh *)&resourceIdentifier,&normalizedSysId);
  chars = normalizedSysId.fBuffer;
  normalizedSysId.fBuffer[normalizedSysId.fIndex] = L'\0';
  expSysId.fMemoryManager = this->fMemoryManager;
  expSysId.fIndex = 0;
  expSysId.fCapacity = 0x3ff;
  expSysId.fFullSize = 0;
  expSysId.fUsed = false;
  expSysId.fFullHandler = (XMLBufferFullHandler *)0x0;
  expSysId.fBuffer = (XMLCh *)0x0;
  iVar4 = (*(expSysId.fMemoryManager)->_vptr_MemoryManager[3])(expSysId.fMemoryManager,0x800);
  expSysId.fBuffer = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
  *expSysId.fBuffer = L'\0';
  pXVar2 = this->fEntityHandler;
  if (pXVar2 == (XMLEntityHandler *)0x0) {
LAB_002b3e7d:
    expSysId.fIndex = 0;
    if ((chars != (XMLCh *)0x0) && (*chars != L'\0')) {
      XMLBuffer::append(&expSysId,chars);
    }
  }
  else {
    iVar4 = (*pXVar2->_vptr_XMLEntityHandler[3])(pXVar2,chars,&expSysId);
    if ((char)iVar4 == '\0') goto LAB_002b3e7d;
  }
  *srcToFill = (InputSource *)0x0;
  pXVar2 = this->fEntityHandler;
  if (pXVar2 != (XMLEntityHandler *)0x0) {
    expSysId.fBuffer[expSysId.fIndex] = L'\0';
    resourceIdentifier.fResourceIdentifierType = ExternalEntity;
    resourceIdentifier.fSystemId = expSysId.fBuffer;
    resourceIdentifier.fNameSpace = L"";
    resourceIdentifier.fPublicId = pubId;
    resourceIdentifier.fBaseURI = baseURI;
    resourceIdentifier.fLocator = &this->super_Locator;
    iVar4 = (*pXVar2->_vptr_XMLEntityHandler[5])();
    *srcToFill = (InputSource *)CONCAT44(extraout_var_01,iVar4);
  }
  if (*srcToFill == (InputSource *)0x0) {
    if (!disableDefaultEntityResolution) {
      if ((baseURI == (XMLCh *)0x0) || (*baseURI == L'\0')) {
        getLastExtEntityInfo(this,&lastInfo);
        baseURI = lastInfo.systemId;
      }
      XMLURL::XMLURL((XMLURL *)&resourceIdentifier,this->fMemoryManager);
      expSysId.fBuffer[expSysId.fIndex] = L'\0';
      bVar3 = XMLURL::setURL((XMLURL *)&resourceIdentifier,baseURI,expSysId.fBuffer,
                             (XMLURL *)&resourceIdentifier);
      if (bVar3) {
        bVar3 = XMLURL::isRelative((XMLURL *)&resourceIdentifier);
        if (bVar3) goto LAB_002b3f86;
        if (this->fStandardUriConformant == true) {
          bVar3 = XMLURL::hasInvalidChar((XMLURL *)&resourceIdentifier);
          if (bVar3) {
            this_02 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
                       ,0x2ec,URL_MalformedURL,this->fMemoryManager);
            goto LAB_002b413f;
          }
        }
        this_01 = (URLInputSource *)XMemory::operator_new(0x88,this->fMemoryManager);
        URLInputSource::URLInputSource(this_01,(XMLURL *)&resourceIdentifier,this->fMemoryManager);
        *srcToFill = (InputSource *)this_01;
      }
      else {
LAB_002b3f86:
        if (this->fStandardUriConformant != false) {
          this_02 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (this_02,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
                     ,0x2e7,URL_MalformedURL,this->fMemoryManager);
LAB_002b413f:
          __cxa_throw(this_02,&MalformedURLException::typeinfo,XMLException::~XMLException);
        }
        resolvedSysId.fMemoryManager = this->fMemoryManager;
        resolvedSysId.fIndex = 0;
        resolvedSysId.fCapacity = 0x3ff;
        resolvedSysId.fFullSize = 0;
        resolvedSysId.fUsed = false;
        resolvedSysId.fFullHandler = (XMLBufferFullHandler *)0x0;
        resolvedSysId.fBuffer = (XMLCh *)0x0;
        iVar4 = (*(resolvedSysId.fMemoryManager)->_vptr_MemoryManager[3])
                          (resolvedSysId.fMemoryManager,0x800);
        resolvedSysId.fBuffer = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
        *resolvedSysId.fBuffer = L'\0';
        expSysId.fBuffer[expSysId.fIndex] = L'\0';
        XMLUri::normalizeURI(expSysId.fBuffer,&resolvedSysId);
        this_00 = (InputSource *)XMemory::operator_new(0x30,this->fMemoryManager);
        resolvedSysId.fBuffer[resolvedSysId.fIndex] = L'\0';
        LocalFileInputSource::LocalFileInputSource
                  ((LocalFileInputSource *)this_00,baseURI,resolvedSysId.fBuffer,
                   this->fMemoryManager);
        *srcToFill = this_00;
        (*(resolvedSysId.fMemoryManager)->_vptr_MemoryManager[4])
                  (resolvedSysId.fMemoryManager,resolvedSysId.fBuffer);
      }
      XMLURL::~XMLURL((XMLURL *)&resourceIdentifier);
      goto LAB_002b4084;
    }
  }
  else {
LAB_002b4084:
    pXVar5 = createReader(this,*srcToFill,false,refFrom,type,source,calcSrcOfs,lowWaterMark);
    if (pXVar5 != (XMLReader *)0x0) {
      uVar1 = this->fNextReaderNum;
      this->fNextReaderNum = uVar1 + 1;
      pXVar5->fReaderNum = (ulong)uVar1;
      goto LAB_002b40da;
    }
  }
  pXVar5 = (XMLReader *)0x0;
LAB_002b40da:
  (*(expSysId.fMemoryManager)->_vptr_MemoryManager[4])(expSysId.fMemoryManager,expSysId.fBuffer);
  (*(normalizedSysId.fMemoryManager)->_vptr_MemoryManager[4])
            (normalizedSysId.fMemoryManager,normalizedSysId.fBuffer);
  return pXVar5;
}

Assistant:

XMLReader* ReaderMgr::createReader( const   XMLCh* const        baseURI
                                    , const XMLCh* const        sysId
                                    , const XMLCh* const        pubId
                                    , const bool                xmlDecl
                                    , const XMLReader::RefFrom  refFrom
                                    , const XMLReader::Types    type
                                    , const XMLReader::Sources  source
                                    ,       InputSource*&       srcToFill
                                    , const bool                calcSrcOfs
                                    ,       XMLSize_t           lowWaterMark
                                    , const bool                disableDefaultEntityResolution)
{
    //Normalize sysId
    XMLBuffer normalizedSysId(1023, fMemoryManager);
    XMLString::removeChar(sysId, 0xFFFF, normalizedSysId);
    const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

    // Create a buffer for expanding the system id
    XMLBuffer expSysId(1023, fMemoryManager);

    //
    //  Allow the entity handler to expand the system id if they choose
    //  to do so.
    //
    if (fEntityHandler)
    {
        if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
            expSysId.set(normalizedURI);
    }
     else
    {
        expSysId.set(normalizedURI);
    }

    // Call the entity resolver interface to get an input source
    srcToFill = 0;
    if (fEntityHandler)
    {
        XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::ExternalEntity,
                            expSysId.getRawBuffer(), XMLUni::fgZeroLenString, pubId, baseURI,
                            this);
        srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
    }

    //
    //  If they didn't create a source via the entity resolver, then we
    //  have to create one on our own.
    //
    if (!srcToFill)
    {
        if (disableDefaultEntityResolution)
            return 0;

        LastExtEntityInfo lastInfo;

        const XMLCh* baseuri=baseURI;
        if(!baseuri || !*baseuri)
        {
            getLastExtEntityInfo(lastInfo);
            baseuri = lastInfo.systemId;
        }

        XMLURL urlTmp(fMemoryManager);
        if ((!urlTmp.setURL(baseuri, expSysId.getRawBuffer(), urlTmp)) ||
            (urlTmp.isRelative()))
        {
            if (!fStandardUriConformant)
            {
                XMLBuffer resolvedSysId(1023, fMemoryManager);
                XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                srcToFill = new (fMemoryManager) LocalFileInputSource
                (
                    baseuri
                    , resolvedSysId.getRawBuffer()
                    , fMemoryManager
                );
            }
            else
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
        }
        else
        {
            if (fStandardUriConformant && urlTmp.hasInvalidChar())
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
        }
    }

    // Put a janitor on the input source
    Janitor<InputSource> janSrc(srcToFill);

    //
    //  Now call the other version with the input source that we have, and
    //  return the resulting reader.
    //
    XMLReader* retVal = createReader
    (
        *srcToFill
        , xmlDecl
        , refFrom
        , type
        , source
        , calcSrcOfs
        , lowWaterMark
    );

    // Either way, we can release the input source now
    janSrc.orphan();

    // If it failed for any reason, then return zero.
    if (!retVal)
        return 0;

    // Give this reader the next available reader number and return it
    retVal->setReaderNum(fNextReaderNum++);
    return retVal;
}